

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O0

void _QuickSortImpl<Memory::_no_write_barrier_policy>::
     Sort<CaseNode*,int(*)(void*,void_const*,void_const*)>
               (CaseNode **arr,size_t count,_func_int_void_ptr_void_ptr_void_ptr **comparer,
               void *context,size_t elementSize)

{
  size_t elementSize_local;
  void *context_local;
  _func_int_void_ptr_void_ptr_void_ptr **comparer_local;
  size_t count_local;
  CaseNode **arr_local;
  
  JsUtil::
  QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>::
  Sort((char *)arr,count,elementSize,*comparer,context);
  return;
}

Assistant:

static void Sort(T* arr, size_t count, const Comparer& comparer, void* context, size_t elementSize = sizeof(T))
    {
#ifndef _WIN32
        JsUtil::QuickSort<Policy, char, Comparer>::Sort((char*)arr, count, elementSize, comparer, context);
#else
        // by default use system qsort_s
        ::qsort_s(arr, count, elementSize, comparer, context);
#endif
    }